

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void lua_insert(lua_State *L,int idx)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  
  pTVar2 = index2adr(L,idx);
  for (pTVar3 = L->top; pTVar2 < pTVar3; pTVar3 = pTVar3 + -1) {
    pTVar3->value = pTVar3[-1].value;
    pTVar3->tt = pTVar3[-1].tt;
  }
  pTVar1 = L->top;
  pTVar2->value = pTVar1->value;
  pTVar2->tt = pTVar1->tt;
  return;
}

Assistant:

static void lua_insert(lua_State*L,int idx){
StkId p;
StkId q;
p=index2adr(L,idx);
api_checkvalidindex(L,p);
for(q=L->top;q>p;q--)setobj(L,q,q-1);
setobj(L,p,L->top);
}